

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O2

void __thiscall
Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
          (Matrix_Dense<double,_0UL,_0UL> *this,
          initializer_list<Disa::Vector_Dense<double,_0UL>_> *list)

{
  ostream *poVar1;
  iterator location;
  vector<double,_std::allocator<double>_> *__x;
  long lVar2;
  vector<double,_std::allocator<double>_> *this_00;
  undefined **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (this->
  super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>).
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>).
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>).
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  resize(&this->
          super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
         ,list->_M_len);
  this_00 = &((this->
              super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ).
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
             super_vector<double,_std::allocator<double>_>;
  __x = &list->_M_array->super_vector<double,_std::allocator<double>_>;
  lVar2 = list->_M_len * 0x18;
  while( true ) {
    if (lVar2 == 0) {
      return;
    }
    location = list->_M_array;
    if ((long)(__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start !=
        (long)(location->super_vector<double,_std::allocator<double>_>).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)(location->super_vector<double,_std::allocator<double>_>).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start) break;
    std::vector<double,_std::allocator<double>_>::operator=(this_00,__x);
    this_00 = this_00 + 1;
    __x = __x + 1;
    lVar2 = lVar2 + -0x18;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
  local_50 = &PTR_s__workspace_llm4binary_github_lic_001726b8;
  console_format_abi_cxx11_(&local_48,(Disa *)0x0,(Log_Level)&local_50,(source_location *)location);
  poVar1 = std::operator<<(poVar1,(string *)&local_48);
  poVar1 = std::operator<<(poVar1,"List dimension varies.");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_48);
  exit(1);
}

Assistant:

Matrix_Dense(const std::initializer_list<Vector_Dense<_type, 0>>& list) {
    resize(list.size());
    auto iter = this->begin();
    FOR_EACH(item, list) {
      ASSERT_DEBUG(item.size() == list.begin()->size(), "List dimension varies.");
      *iter++ = item;
    }
  }